

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::
     stringPrintfRecursive<int_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
               (string *s,char *fmt,int *v,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  _Alloc_hider _Var1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *s_00;
  char cVar8;
  string nextFmt;
  string str_1;
  string str;
  string local_220;
  char *local_200;
  undefined8 local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  char *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  ostream *local_1b8;
  undefined8 local_1b0;
  ostream local_1a8;
  undefined7 uStack_1a7;
  ios_base local_138 [264];
  
  local_1e0 = fmt;
  copyToFormatString(&local_220,&local_1e0,s);
  cVar8 = (char)&local_220;
  lVar4 = std::__cxx11::string::find(cVar8,0x2a);
  lVar5 = std::__cxx11::string::find(cVar8,0x73);
  lVar6 = std::__cxx11::string::find(cVar8,100);
  _Var1._M_p = local_220._M_dataplus._M_p;
  if (lVar4 != -1) {
    s_00 = "MEH";
    iVar3 = 0xbe;
LAB_003c686a:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
             ,iVar3,s_00);
  }
  if (lVar6 == -1) {
    if (lVar5 != -1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::ostream::operator<<(&local_1a8,*v);
      _Var1._M_p = local_220._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      plVar2 = local_1d8;
      iVar3 = snprintf((char *)0x0,0,_Var1._M_p,local_1d8);
      local_1f8 = 0;
      local_1f0 = '\0';
      local_200 = &local_1f0;
      std::__cxx11::string::resize((ulong)&local_200,(char)(iVar3 + 1));
      snprintf(local_200,(long)(iVar3 + 1),_Var1._M_p,plVar2);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::_M_append((char *)s,(ulong)local_200);
      if (local_200 != &local_1f0) {
        operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
      }
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      goto LAB_003c6791;
    }
    if (local_220._M_string_length == 0) {
      s_00 = "Excess values passed to Printf.";
      iVar3 = 0x10d;
      goto LAB_003c686a;
    }
    iVar3 = snprintf((char *)0x0,0,local_220._M_dataplus._M_p,(ulong)(uint)*v);
    local_1b8 = &local_1a8;
    local_1b0 = 0;
    local_1a8 = (ostream)0x0;
    std::__cxx11::string::resize((ulong)&local_1b8,(char)(iVar3 + 1));
    snprintf((char *)local_1b8,(long)(iVar3 + 1),_Var1._M_p,(ulong)(uint)*v);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::_M_append((char *)s,(ulong)local_1b8);
  }
  else {
    uVar7 = std::__cxx11::string::find((char)&local_220,100);
    std::__cxx11::string::replace((ulong)&local_220,uVar7,(char *)0x1,0x4ad72f);
    _Var1._M_p = local_220._M_dataplus._M_p;
    iVar3 = snprintf((char *)0x0,0,local_220._M_dataplus._M_p,(ulong)(uint)*v);
    local_1b8 = &local_1a8;
    local_1b0 = 0;
    local_1a8 = (ostream)0x0;
    std::__cxx11::string::resize((ulong)&local_1b8,(char)(iVar3 + 1));
    snprintf((char *)local_1b8,(long)(iVar3 + 1),_Var1._M_p,(ulong)(uint)*v);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::_M_append((char *)s,(ulong)local_1b8);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
LAB_003c6791:
  stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (s,local_1e0,args,args_1,args_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}